

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructDeserializer.hpp
# Opt level: O2

void mserialize::
     StructDeserializer<binlog::EventSource,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::id>,_std::integral_constant<binlog::Severity_binlog::EventSource::*,_&binlog::EventSource::severity>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::category>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::function>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::file>,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::line>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::formatString>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::argumentTags>_>
     ::deserialize<binlog::Range>(EventSource *t,Range *istream)

{
  detail::TrivialDeserializer<unsigned_long>::deserialize<binlog::Range>(&t->id,istream);
  detail::TrivialDeserializer<binlog::Severity>::deserialize<binlog::Range>(&t->severity,istream);
  detail::
  BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::deserialize<binlog::Range>(&t->category,istream);
  detail::
  BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::deserialize<binlog::Range>(&t->function,istream);
  detail::
  BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::deserialize<binlog::Range>(&t->file,istream);
  detail::TrivialDeserializer<unsigned_long>::deserialize<binlog::Range>(&t->line,istream);
  detail::
  BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::deserialize<binlog::Range>(&t->formatString,istream);
  detail::
  BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::deserialize<binlog::Range>(&t->argumentTags,istream);
  return;
}

Assistant:

static void deserialize(T& t, InputStream& istream)
  {
    using swallow = int[];
    (void)swallow{1, (deserialize_member(t, Members::value, istream), int{})...};
  }